

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckBlockSignature
          (SharedValidator *this,Location *loc,Opcode opcode,Type sig_type,
          TypeVector *out_param_types,TypeVector *out_result_types)

{
  pointer pTVar1;
  Index index;
  Result RVar2;
  Result RVar3;
  char *pcVar4;
  Enum EVar5;
  bool bVar6;
  FuncType func_type;
  Type local_c0;
  Opcode local_bc;
  Location *local_b8;
  TypeVector *local_b0;
  FuncType local_a8;
  Var local_78;
  
  local_c0.enum_ = sig_type.enum_;
  local_bc.enum_ = opcode.enum_;
  if (sig_type.enum_ < Any) {
    pTVar1 = (out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      (out_param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    Type::GetInlineVector(&local_a8.params,&local_c0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_move_assign(out_result_types,&local_a8)
    ;
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_a8);
    EVar5 = Ok;
  }
  else {
    local_b0 = out_result_types;
    index = Type::GetIndex(&local_c0);
    local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8 = loc;
    Var::Var(&local_78,index,loc);
    RVar2 = CheckFuncTypeIndex(this,&local_78,&local_a8);
    bVar6 = RVar2.enum_ == Error;
    Var::~Var(&local_78);
    if ((local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_a8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((this->options_).features.multi_value_enabled_ == false)) {
      pcVar4 = Opcode::GetName(&local_bc);
      RVar3 = PrintError(this,local_b8,"%s params not currently supported.",pcVar4);
      bVar6 = RVar3.enum_ == Error || RVar2.enum_ == Error;
    }
    EVar5 = (Enum)bVar6;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (out_param_types,&local_a8.params);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(local_b0,&local_a8.results);
    FuncType::~FuncType(&local_a8);
  }
  return (Result)EVar5;
}

Assistant:

Result SharedValidator::CheckBlockSignature(const Location& loc,
                                            Opcode opcode,
                                            Type sig_type,
                                            TypeVector* out_param_types,
                                            TypeVector* out_result_types) {
  Result result = Result::Ok;

  if (sig_type.IsIndex()) {
    Index sig_index = sig_type.GetIndex();
    FuncType func_type;
    result |= CheckFuncTypeIndex(Var(sig_index, loc), &func_type);

    if (!func_type.params.empty() && !options_.features.multi_value_enabled()) {
      result |= PrintError(loc, "%s params not currently supported.",
                           opcode.GetName());
    }
    // Multiple results without --enable-multi-value is checked above in
    // OnType.

    *out_param_types = func_type.params;
    *out_result_types = func_type.results;
  } else {
    out_param_types->clear();
    *out_result_types = sig_type.GetInlineVector();
  }

  return result;
}